

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canfdtest.c
# Opt level: O2

void millisleep(int msecs)

{
  uint uVar1;
  timespec rqtp;
  timespec rmtp;
  
  rqtp.tv_sec = 0;
  rqtp.tv_nsec = (__syscall_slong_t)(((uint)msecs % 1000) * 1000000);
  do {
    uVar1 = clock_nanosleep(1,0,(timespec *)&rqtp,(timespec *)&rmtp);
    if ((uVar1 & 0xfffffffb) != 0) {
      puts("t");
      return;
    }
    rqtp.tv_sec = rmtp.tv_sec;
    rqtp.tv_nsec = rmtp.tv_nsec;
  } while (uVar1 != 0);
  return;
}

Assistant:

static void millisleep(int msecs)
{
	struct timespec rqtp, rmtp;
	int err;

	/* sleep in ms */
	rqtp.tv_sec = msecs / 1000;
	rqtp.tv_nsec = msecs % 1000 * 1000000;

	do {
		err = clock_nanosleep(CLOCK_MONOTONIC, 0, &rqtp, &rmtp);
		if (err != 0 && err != EINTR) {
			printf("t\n");
			break;
		}
		rqtp = rmtp;
	} while (err != 0);
}